

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O1

void al_unlock_sample_id(ALLEGRO_SAMPLE_ID *spl_id)

{
  long lVar1;
  
  lVar1 = _al_vector_ref(&auto_samples,spl_id->_index);
  if (*(int *)(lVar1 + 8) == spl_id->_id) {
    *(undefined1 *)(lVar1 + 0xc) = 0;
  }
  return;
}

Assistant:

void al_unlock_sample_id(ALLEGRO_SAMPLE_ID *spl_id)
{
   AUTO_SAMPLE *slot;

   ASSERT(spl_id->_id != -1);
   ASSERT(spl_id->_index < (int) _al_vector_size(&auto_samples));

   slot = _al_vector_ref(&auto_samples, spl_id->_index);
   if (slot->id == spl_id->_id) {
      slot->locked = false;
   }
}